

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char,char[33],std::__cxx11::string,char>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char *args,
                   char (*args_1) [33],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char *args_3)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_e0 [32];
  undefined8 local_c0;
  char *local_b8;
  char local_b0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *pcStack_78;
  undefined8 local_70;
  char *local_68;
  size_t local_60;
  char (*local_58) [33];
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_90._M_len = (a->View_)._M_len;
  local_90._M_str = (a->View_)._M_str;
  local_80 = (b->View_)._M_len;
  pcStack_78 = (b->View_)._M_str;
  local_b0[0] = *args;
  local_b8 = local_b0;
  local_c0 = 1;
  local_70 = 1;
  local_68 = local_b8;
  local_60 = strlen(*args_1);
  local_48 = (args_2->_M_dataplus)._M_p;
  local_50 = args_2->_M_string_length;
  local_e0[0] = *args_3;
  local_38 = local_e0;
  local_40 = 1;
  views._M_len = 6;
  views._M_array = &local_90;
  local_58 = args_1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}